

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * __thiscall ghc::filesystem::path::operator+=(path *this,value_type *x)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  _Alloc_hider _Var3;
  string_type part;
  path local_58;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  std::__cxx11::string::string((string *)&local_38,x,(allocator *)&local_58);
  paVar1 = &local_58._path.field_2;
  puVar2 = local_38;
  local_58._path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_58,local_38,local_38 + local_30);
  postprocess_path_with_format(&local_58,(format)puVar2);
  _Var3._M_p = local_58._path._M_dataplus._M_p;
  std::__cxx11::string::_M_append((char *)this,(ulong)local_58._path._M_dataplus._M_p);
  postprocess_path_with_format(this,(format)_Var3._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._path._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._path._M_dataplus._M_p);
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return this;
}

Assistant:

GHC_INLINE path& path::operator+=(const value_type* x)
{
#ifdef GHC_WITH_STRING_VIEW
    basic_string_view<value_type> part(x);
#else
    string_type part(x);
#endif
    return concat(part);
}